

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.cpp
# Opt level: O0

String * __thiscall
asl::TextFile::readLine(String *__return_storage_ptr__,TextFile *this,char newline)

{
  char x;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  int __oflag;
  char c;
  char newline_local;
  TextFile *this_local;
  String *s;
  
  asl::String::String(__return_storage_ptr__,1000,0);
  pcVar3 = asl::String::operator[](__return_storage_ptr__,0);
  *pcVar3 = '\0';
  if (((this->super_File)._file != (FILE *)0x0) ||
     (uVar2 = open(this,(char *)0x0,__oflag), (uVar2 & 1) != 0)) {
    while( true ) {
      x = File::read<char>(&this->super_File);
      bVar1 = end(this);
      if ((bVar1) || (x == newline)) break;
      asl::String::operator<<(__return_storage_ptr__,x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String TextFile::readLine(char newline)
{
	String s(1000, 0);
	s[0] = '\0';
	if(!_file && !open(READ))
		return s;
	while (1)
	{
		char c = read<char>();
		if (end() || c == newline)
			break;
		s << c;
	}
	return s;
}